

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O1

bool __thiscall Diligent::ThreadPoolImpl::ReprioritizeTask(ThreadPoolImpl *this,IAsyncTask *pTask)

{
  bool bVar1;
  const_iterator __position;
  bool bVar2;
  float extraout_XMM0_Da;
  float Priority;
  unique_lock<std::mutex> lock;
  type ExistingTaskInfo;
  float local_54;
  unique_lock<std::mutex> local_50;
  QueuedTaskInfo local_40;
  
  (*(pTask->super_IObject)._vptr_IObject[9])(pTask);
  local_50._M_device = &this->m_TasksQueueMtx;
  local_50._M_owns = false;
  local_54 = extraout_XMM0_Da;
  std::unique_lock<std::mutex>::lock(&local_50);
  local_50._M_owns = true;
  __position._M_node = (this->m_TasksQueue)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    bVar2 = (_Rb_tree_header *)__position._M_node ==
            &(this->m_TasksQueue)._M_t._M_impl.super__Rb_tree_header;
    bVar1 = !bVar2;
    if (bVar2) {
LAB_0072ef17:
      std::unique_lock<std::mutex>::~unique_lock(&local_50);
      return bVar1;
    }
    if (__position._M_node[1]._M_parent == (_Base_ptr)pTask) {
      if (bVar1) {
        if (((float)__position._M_node[1]._M_color != local_54) ||
           (NAN((float)__position._M_node[1]._M_color) || NAN(local_54))) {
          local_40.pTask.m_pObject = (IAsyncTask *)__position._M_node[1]._M_parent;
          __position._M_node[1]._M_parent = (_Base_ptr)0x0;
          local_40.Prerequisites.
          super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)__position._M_node[1]._M_left;
          local_40.Prerequisites.
          super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)__position._M_node[1]._M_right;
          local_40.Prerequisites.
          super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)(__position._M_node + 2);
          *(undefined8 *)(__position._M_node + 2) = 0;
          __position._M_node[1]._M_left = (_Base_ptr)0x0;
          __position._M_node[1]._M_right = (_Base_ptr)0x0;
          std::
          _Rb_tree<float,_std::pair<const_float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>,_std::_Select1st<std::pair<const_float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>,_std::greater<float>,_std::allocator<std::pair<const_float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>
          ::_M_erase_aux(&(this->m_TasksQueue)._M_t,__position);
          std::
          _Rb_tree<float,std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>,std::_Select1st<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>,std::greater<float>,std::allocator<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>>
          ::_M_emplace_equal<float_const&,Diligent::ThreadPoolImpl::QueuedTaskInfo>
                    ((_Rb_tree<float,std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>,std::_Select1st<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>,std::greater<float>,std::allocator<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>>
                      *)&this->m_TasksQueue,&local_54,&local_40);
          std::
          vector<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
          ::~vector(&local_40.Prerequisites);
          if ((_Base_ptr)local_40.pTask.m_pObject != (_Base_ptr)0x0) {
            (*((local_40.pTask.m_pObject)->super_IObject)._vptr_IObject[2])();
            local_40.pTask.m_pObject = (IAsyncTask *)0x0;
          }
        }
      }
      goto LAB_0072ef17;
    }
    __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
  } while( true );
}

Assistant:

ReprioritizeTask(IAsyncTask* pTask) override final
    {
        const auto Priority = pTask->GetPriority();

        std::unique_lock<std::mutex> lock{m_TasksQueueMtx};

        auto it = m_TasksQueue.begin();
        while (it != m_TasksQueue.end() && it->second.pTask != pTask)
            ++it;
        if (it != m_TasksQueue.end())
        {
            if (it->first != Priority)
            {
                auto ExistingTaskInfo = std::move(it->second);
                m_TasksQueue.erase(it);
                m_TasksQueue.emplace(Priority, std::move(ExistingTaskInfo));
            }

            return true;
        }
        return false;
    }